

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectHdrsWrapper.cpp
# Opt level: O3

bufsize_t __thiscall
SectionHdrWrapper::getContentSize(SectionHdrWrapper *this,addr_type aType,bool recalculate)

{
  uint uVar1;
  uint uVar2;
  IMAGE_SECTION_HEADER *pIVar3;
  PEFile *pPVar4;
  int iVar5;
  bufsize_t bVar6;
  long lVar7;
  offset_t oVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong size;
  undefined4 extraout_var_01;
  ulong uVar10;
  ulong uVar9;
  
  if ((this->header == (IMAGE_SECTION_HEADER *)0x0) ||
     ((this->super_PENodeWrapper).m_PE == (PEFile *)0x0)) {
    return 0;
  }
  if (recalculate) {
    if (aType != RAW) {
      if ((aType & ~RAW) != RVA) {
        return 0;
      }
      bVar6 = getMappedVirtualSize(this);
      return bVar6;
    }
    oVar8 = getContentOffset(this,RAW,true);
    if (oVar8 != 0xffffffffffffffff) {
      iVar5 = (*(((this->super_PENodeWrapper).m_PE)->super_MappedExe).super_Executable.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])();
      uVar9 = CONCAT44(extraout_var,iVar5);
      uVar10 = uVar9 - oVar8;
      if (((oVar8 <= uVar9) && (pIVar3 = this->header, pIVar3 != (IMAGE_SECTION_HEADER *)0x0)) &&
         (uVar1 = pIVar3->SizeOfRawData, uVar1 != 0)) {
        uVar2 = (pIVar3->Misc).PhysicalAddress;
        if ((pIVar3->Misc).PhysicalAddress == 0) {
          uVar2 = uVar1;
        }
        bVar6 = (bufsize_t)uVar2;
        size = (ulong)uVar1;
        if (uVar2 < uVar1) {
          size = bVar6;
        }
        pPVar4 = (this->super_PENodeWrapper).m_PE;
        iVar5 = (*(pPVar4->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x10])(pPVar4,1);
        if (CONCAT44(extraout_var_00,iVar5) != 0) {
          size = buf_util::roundupToUnit(size,CONCAT44(extraout_var_00,iVar5));
        }
        if (oVar8 + size <= uVar9) {
          return size;
        }
        pPVar4 = (this->super_PENodeWrapper).m_PE;
        iVar5 = (*(pPVar4->super_MappedExe).super_Executable.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[0x10])(pPVar4,2);
        if (CONCAT44(extraout_var_01,iVar5) != 0) {
          bVar6 = buf_util::roundupToUnit(bVar6,CONCAT44(extraout_var_01,iVar5));
        }
        uVar9 = bVar6;
        if (uVar10 < bVar6) {
          uVar9 = uVar10;
        }
        if (bVar6 != 0) {
          return uVar9;
        }
        return uVar10;
      }
    }
    return 0;
  }
  lVar7 = 0x10;
  if ((aType != RAW) && (lVar7 = 8, (aType & ~RAW) != RVA)) {
    return 0;
  }
  return (ulong)*(uint *)(this->header->Name + lVar7);
}

Assistant:

bufsize_t SectionHdrWrapper::getContentSize(Executable::addr_type aType, bool recalculate)
{
    if (!this->header || !m_PE) return 0;

    bufsize_t size = 0;
    if (!recalculate) {
        size = getContentDeclaredSize(aType);
        //printf("Declared size = %llx\n---\n", size);
        return size;
    }
    //---
    if (aType == Executable::RAW) {
        //printf ("R: ");
        size = getMappedRawSize();
    }
    if (aType == Executable::RVA || aType == Executable::VA) {
        size = getMappedVirtualSize();
        //printf ("V: ");
    }
    //printf("Mapped size = %llx\n", size);
    return size;
}